

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EntryNode.cpp
# Opt level: O0

void __thiscall EntryNode::EntryNode(EntryNode *this)

{
  Instruction *in_RDI;
  Node *unaff_retaddr;
  CallInst *in_stack_ffffffffffffffe8;
  
  Node::Node(unaff_retaddr,(NodeType)((ulong)in_RDI >> 0x20),in_RDI,in_stack_ffffffffffffffe8);
  *(undefined ***)in_RDI = &PTR__EntryNode_001cdba8;
  std::set<ForkNode_*,_std::less<ForkNode_*>,_std::allocator<ForkNode_*>_>::set
            ((set<ForkNode_*,_std::less<ForkNode_*>,_std::allocator<ForkNode_*>_> *)0x190da3);
  return;
}

Assistant:

EntryNode::EntryNode() : Node(NodeType::ENTRY) {}